

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void accum_3d(float32 ***out,float32 ***in,uint32 d1,uint32 d2,uint32 d3)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  for (uVar1 = 0; uVar1 != d1; uVar1 = uVar1 + 1) {
    for (uVar2 = 0; uVar2 != d2; uVar2 = uVar2 + 1) {
      for (uVar3 = 0; d3 != uVar3; uVar3 = uVar3 + 1) {
        out[uVar1][uVar2][uVar3] =
             (float32)((float)in[uVar1][uVar2][uVar3] + (float)out[uVar1][uVar2][uVar3]);
      }
    }
  }
  return;
}

Assistant:

void
accum_3d(float32 ***out,
	 float32 ***in,
	 uint32 d1,
	 uint32 d2,
	 uint32 d3)
{
    uint32 i, j, k;

    for (i = 0; i < d1; i++) {
	for (j = 0; j < d2; j++) {
	    for (k = 0; k < d3; k++) {
		out[i][j][k] += in[i][j][k];
	    }
	}
    }
}